

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O2

void Gia_ManMarkAutonomous(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  
  Gia_ManCleanMark0(p);
  Gia_ManIncrementTravId(p);
  for (iVar2 = 0; iVar2 < p->nRegs; iVar2 = iVar2 + 1) {
    pGVar1 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar2);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    Gia_ManMarkAutonomous_rec(p,pGVar1);
  }
  Gia_ManIncrementTravId(p);
  for (iVar2 = 0; iVar2 < p->nRegs; iVar2 = iVar2 + 1) {
    pGVar1 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar2);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    if ((pGVar1->field_0x3 & 0x40) != 0) {
      Gia_ObjSetTravIdCurrent(p,pGVar1);
    }
  }
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Gia_ManMarkAutonomous( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanMark0( p );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManMarkAutonomous_rec( p, pObj );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachRo( p, pObj, i )
        if ( pObj->fMark0 )
            Gia_ObjSetTravIdCurrent( p, pObj );
    Gia_ManCleanMark0( p );
}